

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlp.h
# Opt level: O2

void __thiscall seeta::fd::MLPLayer::SetSize(MLPLayer *this,int32_t inputDim,int32_t outputDim)

{
  if (outputDim < 1 || inputDim < 1) {
    return;
  }
  this->input_dim_ = inputDim;
  this->output_dim_ = outputDim;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->weights_,(ulong)(uint)(inputDim * outputDim));
  std::vector<float,_std::allocator<float>_>::resize(&this->bias_,(ulong)(uint)outputDim);
  return;
}

Assistant:

inline void SetSize(int32_t inputDim, int32_t outputDim) {
    if (inputDim <= 0 || outputDim <= 0) {
      return;  // @todo handle the errors!!!
    }
    input_dim_ = inputDim;
    output_dim_ = outputDim;
    weights_.resize(inputDim * outputDim);
    bias_.resize(outputDim);
  }